

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_ELSE(Context *ctx)

{
  int iVar1;
  char local_68 [8];
  char elsebranch [32];
  char local_38 [4];
  int elselabel;
  char endbranch [32];
  int endlabel;
  Context *ctx_local;
  
  if ((ctx->profile_supports_nv4 == 0) &&
     ((ctx->profile_supports_nv2 == 0 || (iVar1 = shader_is_pixel(ctx), iVar1 == 0)))) {
    if (ctx->profile_supports_nv2 == 0) {
      failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
    }
    else {
      if (ctx->branch_labels_stack_index < 1) {
        __assert_fail("ctx->branch_labels_stack_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1ecb,"void emit_ARB1_ELSE(Context *)");
      }
      endbranch._28_4_ = allocate_branch_label(ctx);
      get_ARB1_branch_label_name(ctx,endbranch._28_4_,local_38,0x20);
      output_line(ctx,"BRA %s;",local_38);
      get_ARB1_branch_label_name
                (ctx,ctx->branch_labels_stack[ctx->branch_labels_stack_index + -1],local_68,0x20);
      output_line(ctx,"%s:",local_68);
      ctx->branch_labels_stack[ctx->branch_labels_stack_index + -1] = endbranch._28_4_;
    }
  }
  else {
    output_line(ctx,"ELSE;");
  }
  return;
}

Assistant:

static void emit_ARB1_ELSE(Context *ctx)
{
    // nv2 fragment programs (and everything nv4) have a real ELSE.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "ELSE;");

    else if (support_nv2(ctx))
    {
        // there's no ELSE construct, but we can use a branch to a label.
        assert(ctx->branch_labels_stack_index > 0);

        // At the end of the IF block, unconditionally jump to the ENDIF.
        const int endlabel = allocate_branch_label(ctx);
        char endbranch[32];
        get_ARB1_branch_label_name(ctx,endlabel,endbranch,sizeof (endbranch));
        output_line(ctx, "BRA %s;", endbranch);

        // Now mark the ELSE section with a lable.
        const int elselabel = ctx->branch_labels_stack[ctx->branch_labels_stack_index-1];
        char elsebranch[32];
        get_ARB1_branch_label_name(ctx,elselabel,elsebranch,sizeof(elsebranch));
        output_line(ctx, "%s:", elsebranch);

        // Replace the ELSE label with the ENDIF on the label stack.
        ctx->branch_labels_stack[ctx->branch_labels_stack_index-1] = endlabel;
    } // else if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}